

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int CustomSetup(VP8Io *io)

{
  uint uVar1;
  undefined8 *puVar2;
  rescaler_t *dst;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  rescaler_t *prVar11;
  void *pvVar12;
  WebPRescaler *pWVar13;
  long lVar14;
  long lVar15;
  code *pcVar16;
  long lVar17;
  size_t size;
  WebPRescaler *pWVar18;
  int dst_height;
  int src_width;
  long lVar19;
  int iVar20;
  bool bVar21;
  
  puVar5 = (undefined8 *)io->opaque;
  uVar3 = *(uint *)*puVar5;
  if ((uVar3 - 1 < 0xc) && ((0x81dU >> (uVar3 - 1 & 0x1f) & 1) != 0)) {
    bVar21 = false;
  }
  else {
    bVar21 = uVar3 - 0xb < 0xfffffffc;
  }
  puVar5[0xc] = 0;
  puVar5[0xd] = 0;
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  iVar7 = WebPIoInitFromOptions((WebPDecoderOptions *)puVar5[5],io,bVar21 + MODE_YUV);
  if (iVar7 == 0) {
    return 0;
  }
  if (0xfffffffb < uVar3 - 0xb && bVar21 == false) {
    WebPInitUpsamplers();
  }
  puVar2 = puVar5 + 10;
  if (io->use_scaling == 0) {
    if (uVar3 < 0xb) {
      WebPInitSamplers();
      puVar5[0xb] = EmitSampledRGB;
      if (io->fancy_upsampling != 0) {
        uVar10 = (long)io->mb_w + 1;
        pvVar12 = WebPSafeMalloc(1,(uVar10 & 0xfffffffffffffffe) + (long)io->mb_w);
        *puVar2 = pvVar12;
        if (pvVar12 == (void *)0x0) {
          return 0;
        }
        puVar5[1] = pvVar12;
        lVar15 = (long)io->mb_w + (long)pvVar12;
        puVar5[2] = lVar15;
        puVar5[3] = ((int)uVar10 >> 1) + lVar15;
        puVar5[0xb] = EmitFancyRGB;
        WebPInitUpsamplers();
      }
    }
    else {
      puVar5[0xb] = EmitYUV;
    }
    if (bVar21 != false) {
      return 1;
    }
    if ((uVar3 == 10) || (uVar3 == 5)) {
      puVar5[0xc] = EmitAlphaRGBA4444;
    }
    else {
      pcVar16 = EmitAlphaRGB;
      if (10 < uVar3) {
        pcVar16 = EmitAlphaYUV;
      }
      puVar5[0xc] = pcVar16;
      if (10 < uVar3) {
        return 1;
      }
    }
  }
  else {
    piVar6 = (int *)*puVar5;
    iVar7 = *piVar6;
    uVar1 = iVar7 - 1;
    if (uVar3 < 0xb) {
      if ((uVar1 < 0xc) && ((0x81dU >> (uVar1 & 0x1f) & 1) != 0)) {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)(iVar7 - 0xbU < 0xfffffffc);
      }
      iVar7 = io->scaled_width;
      lVar19 = (long)iVar7;
      iVar4 = io->scaled_height;
      iVar9 = io->mb_w;
      iVar20 = io->mb_h;
      lVar14 = 4 - uVar10;
      lVar17 = lVar19 * 2 * lVar14;
      lVar15 = lVar14 * lVar19 + lVar17 * 4;
      prVar11 = (rescaler_t *)WebPSafeMalloc(1,lVar14 * 0x68 + lVar15 + 0x1f);
      *puVar2 = prVar11;
      if (prVar11 == (rescaler_t *)0x0) {
        return 0;
      }
      dst = prVar11 + lVar17;
      pWVar18 = (WebPRescaler *)((long)prVar11 + lVar15 + 0x1f & 0xffffffffffffffe0);
      puVar5[6] = pWVar18;
      puVar5[7] = pWVar18 + 1;
      pWVar13 = (WebPRescaler *)0x0;
      if ((char)uVar10 == '\0') {
        pWVar13 = pWVar18 + 3;
      }
      puVar5[8] = pWVar18 + 2;
      puVar5[9] = pWVar13;
      iVar8 = WebPRescalerInit(pWVar18,io->mb_w,io->mb_h,(uint8_t *)dst,iVar7,iVar4,0,1,prVar11);
      if (iVar8 == 0) {
        return 0;
      }
      iVar8 = iVar9 + 1 >> 1;
      iVar20 = iVar20 + 1 >> 1;
      iVar9 = WebPRescalerInit((WebPRescaler *)puVar5[7],iVar8,iVar20,
                               (uint8_t *)((long)dst + lVar19),iVar7,iVar4,0,1,prVar11 + lVar19 * 2)
      ;
      if (iVar9 == 0) {
        return 0;
      }
      iVar9 = WebPRescalerInit((WebPRescaler *)puVar5[8],iVar8,iVar20,
                               (uint8_t *)((long)dst + lVar19 * 2),iVar7,iVar4,0,1,
                               prVar11 + lVar19 * 4);
      if (iVar9 == 0) {
        return 0;
      }
      puVar5[0xb] = EmitRescaledRGB;
      WebPInitYUV444Converters();
      if ((char)uVar10 != '\0') {
        return 1;
      }
      iVar7 = WebPRescalerInit((WebPRescaler *)puVar5[9],io->mb_w,io->mb_h,
                               (uint8_t *)((long)dst + (long)(iVar7 * 3)),iVar7,iVar4,0,1,
                               prVar11 + lVar19 * 6);
      if (iVar7 == 0) {
        return 0;
      }
      puVar5[0xc] = EmitRescaledAlphaRGB;
      pcVar16 = ExportAlpha;
      if (*(int *)*puVar5 == 10) {
        pcVar16 = ExportAlphaRGBA4444;
      }
      if (*(int *)*puVar5 == 5) {
        pcVar16 = ExportAlphaRGBA4444;
      }
      puVar5[0xd] = pcVar16;
    }
    else {
      if ((uVar1 < 0xc) && ((0x81dU >> (uVar1 & 0x1f) & 1) != 0)) {
        bVar21 = false;
      }
      else {
        bVar21 = iVar7 - 0xbU < 0xfffffffc;
      }
      iVar7 = io->scaled_width;
      lVar19 = (long)iVar7;
      iVar4 = io->scaled_height;
      iVar9 = io->mb_w;
      iVar20 = io->mb_h;
      uVar10 = lVar19 + 1U & 0xfffffffffffffffe;
      lVar15 = lVar19 * 2 + uVar10 * 2;
      lVar14 = 0;
      if (!bVar21) {
        lVar14 = lVar19 * 8;
      }
      size = lVar14 + 0x1bf + lVar15 * 4;
      if (bVar21) {
        size = lVar14 + 0x157 + lVar15 * 4;
      }
      prVar11 = (rescaler_t *)WebPSafeMalloc(1,size);
      *puVar2 = prVar11;
      if (prVar11 == (rescaler_t *)0x0) {
        return 0;
      }
      pWVar18 = (WebPRescaler *)((long)prVar11 + lVar15 * 4 + lVar14 + 0x1f & 0xffffffffffffffe0);
      puVar5[6] = pWVar18;
      puVar5[7] = pWVar18 + 1;
      puVar5[8] = pWVar18 + 2;
      pWVar13 = (WebPRescaler *)0x0;
      if (!bVar21) {
        pWVar13 = pWVar18 + 3;
      }
      puVar5[9] = pWVar13;
      iVar8 = WebPRescalerInit(pWVar18,io->mb_w,io->mb_h,*(uint8_t **)(piVar6 + 4),iVar7,iVar4,
                               piVar6[0xc],1,prVar11);
      if (iVar8 == 0) {
        return 0;
      }
      iVar8 = (int)(lVar19 + 1U) >> 1;
      dst_height = iVar4 + 1 >> 1;
      src_width = iVar9 + 1 >> 1;
      iVar20 = iVar20 + 1 >> 1;
      prVar11 = prVar11 + lVar19 * 2;
      iVar9 = WebPRescalerInit((WebPRescaler *)puVar5[7],src_width,iVar20,*(uint8_t **)(piVar6 + 6),
                               iVar8,dst_height,piVar6[0xd],1,prVar11);
      if ((iVar9 == 0) ||
         (iVar9 = WebPRescalerInit((WebPRescaler *)puVar5[8],src_width,iVar20,
                                   *(uint8_t **)(piVar6 + 8),iVar8,dst_height,piVar6[0xe],1,
                                   prVar11 + uVar10), iVar9 == 0)) {
        return 0;
      }
      puVar5[0xb] = EmitRescaledYUV;
      if (bVar21) {
        return 1;
      }
      iVar7 = WebPRescalerInit((WebPRescaler *)puVar5[9],io->mb_w,io->mb_h,
                               *(uint8_t **)(piVar6 + 10),iVar7,iVar4,piVar6[0xf],1,
                               prVar11 + uVar10 * 2);
      if (iVar7 == 0) {
        return 0;
      }
      puVar5[0xc] = EmitRescaledAlphaYUV;
    }
  }
  WebPInitAlphaProcessing();
  return 1;
}

Assistant:

static int CustomSetup(VP8Io* io) {
  WebPDecParams* const p = (WebPDecParams*)io->opaque;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int is_rgb = WebPIsRGBMode(colorspace);
  const int is_alpha = WebPIsAlphaMode(colorspace);

  p->memory = NULL;
  p->emit = NULL;
  p->emit_alpha = NULL;
  p->emit_alpha_row = NULL;
  if (!WebPIoInitFromOptions(p->options, io, is_alpha ? MODE_YUV : MODE_YUVA)) {
    return 0;
  }
  if (is_alpha && WebPIsPremultipliedMode(colorspace)) {
    WebPInitUpsamplers();
  }
  if (io->use_scaling) {
#if !defined(WEBP_REDUCE_SIZE)
    const int ok = is_rgb ? InitRGBRescaler(io, p) : InitYUVRescaler(io, p);
    if (!ok) {
      return 0;    // memory error
    }
#else
    return 0;   // rescaling support not compiled
#endif
  } else {
    if (is_rgb) {
      WebPInitSamplers();
      p->emit = EmitSampledRGB;   // default
      if (io->fancy_upsampling) {
#ifdef FANCY_UPSAMPLING
        const int uv_width = (io->mb_w + 1) >> 1;
        p->memory = WebPSafeMalloc(1ULL, (size_t)(io->mb_w + 2 * uv_width));
        if (p->memory == NULL) {
          return 0;   // memory error.
        }
        p->tmp_y = (uint8_t*)p->memory;
        p->tmp_u = p->tmp_y + io->mb_w;
        p->tmp_v = p->tmp_u + uv_width;
        p->emit = EmitFancyRGB;
        WebPInitUpsamplers();
#endif
      }
    } else {
      p->emit = EmitYUV;
    }
    if (is_alpha) {  // need transparency output
      p->emit_alpha =
          (colorspace == MODE_RGBA_4444 || colorspace == MODE_rgbA_4444) ?
              EmitAlphaRGBA4444
          : is_rgb ? EmitAlphaRGB
          : EmitAlphaYUV;
      if (is_rgb) {
        WebPInitAlphaProcessing();
      }
    }
  }

  return 1;
}